

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFieldsToString
          (Printer *this,UnknownFieldSet *unknown_fields,string *output)

{
  bool bVar1;
  LogMessage *pLVar2;
  undefined1 local_68 [8];
  StringOutputStream output_stream;
  LogFinisher local_29;
  
  if (output == (string *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/text_format.cc"
               ,0x755);
    pLVar2 = internal::LogMessage::operator<<((LogMessage *)local_68,"CHECK failed: output: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"output specified is nullptr");
    internal::LogFinisher::operator=(&local_29,pLVar2);
    internal::LogMessage::~LogMessage((LogMessage *)local_68);
  }
  output->_M_string_length = 0;
  *(output->_M_dataplus)._M_p = '\0';
  io::StringOutputStream::StringOutputStream((StringOutputStream *)local_68,output);
  bVar1 = PrintUnknownFields(this,unknown_fields,(ZeroCopyOutputStream *)local_68);
  return bVar1;
}

Assistant:

bool TextFormat::Printer::PrintUnknownFieldsToString(
    const UnknownFieldSet& unknown_fields, std::string* output) const {
  GOOGLE_DCHECK(output) << "output specified is nullptr";

  output->clear();
  io::StringOutputStream output_stream(output);
  return PrintUnknownFields(unknown_fields, &output_stream);
}